

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O2

int rw::getNextEdge(StripNode *n,int32 last)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (uVar1 == 3) {
      return -1;
    }
    if (((uint)last != uVar1) && ((n->e[uVar1].field_0x4 & 8) != 0)) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

static int
getNextEdge(StripNode *n, int32 last)
{
	int32 i;
	for(i = 0; i < 3; i++)
		if(n->e[i].isStrip && i != last)
			return i;
	return -1;
}